

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall
amrex::MLEBABecLap::setEBDirichlet(MLEBABecLap *this,int amrlev,MultiFab *phi,MultiFab *beta)

{
  bool bVar1;
  int *piVar2;
  FabArray<amrex::FArrayBox> *this_00;
  Periodicity *period;
  FabArray<amrex::EBCellFlagFab> *this_01;
  MFItInfo *this_02;
  pointer this_03;
  FabArrayBase *in_RCX;
  long *in_RDI;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Array4<const_amrex::EBCellFlag> *flag;
  Array4<const_double> *betain;
  Array4<const_double> *phiin;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  FabType t;
  Array4<double> *betaout;
  Array4<double> *phiout;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  int mglev_1;
  int ngrow;
  int mglev;
  bool phi_on_centroid;
  int beta_ncomp;
  int ncomp;
  MFIter *in_stack_fffffffffffff7e8;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f8;
  FabType in_stack_fffffffffffff7fc;
  undefined1 cross;
  FabArrayBase *in_stack_fffffffffffff818;
  Geometry *in_stack_fffffffffffff820;
  int *in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff834;
  int iVar3;
  BoxArray *in_stack_fffffffffffff838;
  MFIter *in_stack_fffffffffffff850;
  int local_780;
  int local_77c;
  int local_778;
  int local_774;
  int local_730;
  int local_72c;
  int local_728;
  int local_724;
  Box *in_stack_fffffffffffff910;
  int in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff91c;
  long local_6e0;
  long local_6d8;
  long local_6d0;
  int local_6c0;
  int local_6bc;
  int local_6b8;
  long *local_6a0;
  long local_698 [8];
  long *local_658;
  long local_650 [8];
  long *local_610;
  int local_608;
  int local_604;
  int local_600;
  int local_5fc;
  char *in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa14;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  long local_5b8 [8];
  long *local_578;
  long local_570 [8];
  long *local_530;
  int local_524 [7];
  int *local_508;
  MFIter local_500;
  MFItInfo local_49c;
  FabArray<amrex::EBCellFlagFab> *local_488;
  Periodicity *local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined4 local_444;
  int local_438;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  uint local_3f4;
  undefined4 local_3f0;
  byte local_3e9;
  int local_3e8;
  int local_3e4;
  FabArrayBase *local_3e0;
  undefined8 local_3c0;
  undefined4 local_3b4;
  char *local_3b0;
  char *local_3a8;
  undefined8 local_3a0;
  int local_398;
  int *local_390;
  int local_384;
  int iStack_380;
  int local_37c;
  Box *local_378;
  int local_370;
  int *local_368;
  int local_35c;
  int iStack_358;
  int local_354;
  undefined8 local_350;
  int local_348;
  int *local_340;
  int local_334;
  int iStack_330;
  int local_32c;
  undefined8 local_328;
  int local_320;
  int *local_318;
  int local_30c;
  int iStack_308;
  int local_304;
  undefined8 local_300;
  int local_2f8;
  int *local_2f0;
  int local_2e4;
  int iStack_2e0;
  int local_2dc;
  undefined8 local_2d8;
  int local_2d0;
  int *local_2c8;
  int local_2bc;
  int iStack_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  long *local_2a0;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  long *local_288;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  long *local_270;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  long *local_258;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  long *local_240;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  long *local_228;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  long *local_210;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  long *local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  long *local_1e0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  long *local_1c8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  long *local_1b0;
  int local_1a4;
  int local_1a0;
  int local_19c;
  long *local_198;
  uint *local_190;
  uint *local_188;
  undefined4 local_180;
  int local_17c;
  int local_178;
  int local_174;
  long *local_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  long *local_158;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  long *local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  long *local_128;
  undefined4 local_11c;
  int *local_118;
  undefined4 local_10c;
  int *local_108;
  undefined4 local_fc;
  int *local_f8;
  undefined4 local_ec;
  int *local_e8;
  undefined4 local_dc;
  int *local_d8;
  undefined4 local_cc;
  int *local_c8;
  undefined4 local_bc;
  int *local_b8;
  undefined4 local_ac;
  int *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  int *local_88;
  undefined4 local_7c;
  int *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_3e0 = in_RCX;
  local_3e4 = (**(code **)(*in_RDI + 0x28))();
  local_3e8 = FabArrayBase::nComp(local_3e0);
  local_3e9 = *(int *)((long)in_RDI + 0x32c) == 3;
  if ((local_3e8 != 1) && (local_3e8 != local_3e4)) {
    local_3a8 = "beta_ncomp == 1 || beta_ncomp == ncomp";
    local_3b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBABecLap.cpp"
    ;
    local_3b4 = 0xc0;
    local_3c0 = 0;
    Assert_host((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                in_stack_fffffffffffffa14,in_stack_fffffffffffffa08);
  }
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
  bVar1 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  if (bVar1) {
    local_3f0 = 0;
    local_3f4 = local_3e9 & 1;
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
    in_stack_fffffffffffff838 =
         Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                   ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                    in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
    local_418 = 0;
    uStack_410 = 0;
    local_428 = 0;
    uStack_420 = 0;
    local_408 = 0;
    MFInfo::MFInfo((MFInfo *)0x17794f4);
    Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                  *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
    Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                  *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
    in_stack_fffffffffffff7e8 =
         (MFIter *)
         std::
         unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      *)in_stack_fffffffffffff7f0);
    in_stack_fffffffffffff850 = in_stack_fffffffffffff7e8;
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
              (in_stack_fffffffffffff838,
               (DistributionMapping *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
               in_stack_fffffffffffff828,(int *)in_stack_fffffffffffff820,
               (MFInfo *)in_stack_fffffffffffff818,
               (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff7e8);
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff7f0,
               (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff7e8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff7f0);
    MFInfo::~MFInfo((MFInfo *)0x17795a8);
  }
  Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
  bVar1 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  if (bVar1) {
    local_438 = 0;
    while (iVar3 = local_438,
          piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7f0,
                              (size_type)in_stack_fffffffffffff7e8), iVar3 < *piVar2) {
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
      in_stack_fffffffffffff818 =
           (FabArrayBase *)
           Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                     ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                      in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
      in_stack_fffffffffffff820 =
           (Geometry *)
           Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
           operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                       *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
      local_444 = 0;
      local_468 = 0;
      uStack_460 = 0;
      local_478 = 0;
      uStack_470 = 0;
      local_458 = 0;
      MFInfo::MFInfo((MFInfo *)0x17796d8);
      Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
      Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
      in_stack_fffffffffffff7e8 =
           (MFIter *)
           std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        *)in_stack_fffffffffffff7f0);
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
                (in_stack_fffffffffffff838,
                 (DistributionMapping *)CONCAT44(iVar3,in_stack_fffffffffffff830),
                 (int *)in_stack_fffffffffffff7e8,(int *)in_stack_fffffffffffff820,
                 (MFInfo *)in_stack_fffffffffffff818,
                 (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff850);
      Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                    *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff7f0,
                 (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff7e8);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff7f0);
      MFInfo::~MFInfo((MFInfo *)0x177979f);
      local_438 = local_438 + 1;
    }
  }
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
  this_00 = (FabArray<amrex::FArrayBox> *)
            std::
            unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   *)in_stack_fffffffffffff7f0);
  if (this_00 == (FabArray<amrex::FArrayBox> *)0x0) {
    period = (Periodicity *)0x0;
  }
  else {
    period = (Periodicity *)
             __dynamic_cast(this_00,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
  }
  local_480 = period;
  if (period == (Periodicity *)0x0) {
    this_01 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    this_01 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                        ((EBFArrayBoxFactory *)in_stack_fffffffffffff7f0);
  }
  local_488 = this_01;
  MFItInfo::MFItInfo((MFItInfo *)this_01);
  this_02 = MFItInfo::EnableTiling(&local_49c,(IntVect *)&FabArrayBase::mfiter_tile_size);
  MFItInfo::SetDynamic(this_02,true);
  MFIter::MFIter((MFIter *)in_stack_fffffffffffff820,in_stack_fffffffffffff818,(MFItInfo *)this_00);
  while( true ) {
    bVar1 = MFIter::isValid(&local_500);
    cross = (undefined1)((ulong)this_01 >> 0x38);
    if (!bVar1) break;
    MFIter::tilebox(in_stack_fffffffffffff850);
    local_508 = local_524;
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1779937);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
               (MFIter *)in_stack_fffffffffffff7f0);
    local_530 = local_570;
    Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x177998c);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
               (MFIter *)in_stack_fffffffffffff7f0);
    local_578 = local_5b8;
    if (local_488 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      in_stack_fffffffffffff7fc = regular;
    }
    else {
      FabArray<amrex::EBCellFlagFab>::operator[]
                (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
      in_stack_fffffffffffff7fc =
           EBCellFlagFab::getType
                     ((EBCellFlagFab *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918)
                      ,in_stack_fffffffffffff910);
    }
    if ((in_stack_fffffffffffff7fc == regular) || (in_stack_fffffffffffff7fc == covered)) {
      local_340 = local_508;
      local_68 = local_508;
      local_6c = 0;
      local_334 = *local_508;
      local_78 = local_508;
      local_7c = 1;
      iStack_330 = local_508[1];
      local_350 = *(undefined8 *)local_508;
      local_88 = local_508;
      local_8c = 2;
      local_348 = local_508[2];
      local_2c8 = local_508;
      local_f8 = local_508 + 3;
      local_fc = 0;
      local_2bc = *local_f8;
      local_108 = local_508 + 3;
      local_10c = 1;
      iStack_2b8 = local_508[4];
      local_2d8 = *(undefined8 *)local_f8;
      local_118 = local_508 + 3;
      local_11c = 2;
      local_2d0 = local_508[5];
      for (local_5fc = 0; iVar3 = local_348, local_32c = local_348, local_2b4 = local_2d0,
          local_5fc < local_3e4; local_5fc = local_5fc + 1) {
        while (local_600 = iVar3, iVar3 = iStack_330, local_600 <= local_2d0) {
          while (local_604 = iVar3, iVar3 = local_334, local_604 <= iStack_2b8) {
            while (local_608 = iVar3, local_608 <= local_2bc) {
              local_1c8 = local_530;
              local_1cc = local_608;
              local_1d0 = local_604;
              local_1d4 = local_600;
              local_1d8 = local_5fc;
              *(undefined8 *)
               (*local_530 +
               ((long)(local_608 - (int)local_530[4]) +
                (long)(local_604 - *(int *)((long)local_530 + 0x24)) * local_530[1] +
                (long)(local_600 - (int)local_530[5]) * local_530[2] +
               (long)local_5fc * local_530[3]) * 8) = 0;
              local_1e0 = local_578;
              local_1e4 = local_608;
              local_1e8 = local_604;
              local_1ec = local_600;
              local_1f0 = local_5fc;
              *(undefined8 *)
               (*local_578 +
               ((long)(local_608 - (int)local_578[4]) +
                (long)(local_604 - *(int *)((long)local_578 + 0x24)) * local_578[1] +
                (long)(local_600 - (int)local_578[5]) * local_578[2] +
               (long)local_5fc * local_578[3]) * 8) = 0;
              iVar3 = local_608 + 1;
            }
            iVar3 = local_604 + 1;
          }
          iVar3 = local_600 + 1;
        }
      }
    }
    else {
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                 (MFIter *)in_stack_fffffffffffff7f0);
      local_610 = local_650;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                 (MFIter *)in_stack_fffffffffffff7f0);
      local_658 = local_698;
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                ((FabArray<amrex::EBCellFlagFab> *)
                 CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                 (MFIter *)in_stack_fffffffffffff7f0);
      local_6a0 = &local_6e0;
      if (local_3e8 == local_3e4) {
        local_368 = local_508;
        local_38 = local_508;
        local_3c = 0;
        local_35c = *local_508;
        local_48 = local_508;
        local_4c = 1;
        iStack_358 = local_508[1];
        in_stack_fffffffffffff910 = *(Box **)local_508;
        local_58 = local_508;
        local_5c = 2;
        in_stack_fffffffffffff918 = local_508[2];
        local_2f0 = local_508;
        local_c8 = local_508 + 3;
        local_cc = 0;
        local_2e4 = *local_c8;
        local_d8 = local_508 + 3;
        local_dc = 1;
        iStack_2e0 = local_508[4];
        local_300 = *(undefined8 *)local_c8;
        local_e8 = local_508 + 3;
        local_ec = 2;
        local_2f8 = local_508[5];
        for (local_724 = 0; local_728 = in_stack_fffffffffffff918,
            local_378 = in_stack_fffffffffffff910, local_370 = in_stack_fffffffffffff918,
            local_354 = in_stack_fffffffffffff918, local_2dc = local_2f8, local_724 < local_3e4;
            local_724 = local_724 + 1) {
          for (; local_72c = iStack_358, local_728 <= local_2f8; local_728 = local_728 + 1) {
            for (; local_730 = local_35c, local_72c <= iStack_2e0; local_72c = local_72c + 1) {
              for (; local_730 <= local_2e4; local_730 = local_730 + 1) {
                local_19c = local_730;
                local_1a0 = local_72c;
                local_1a4 = local_728;
                local_188 = (uint *)(local_6e0 +
                                    ((long)(local_730 - local_6c0) +
                                     (local_72c - local_6bc) * local_6d8 +
                                    (local_728 - local_6b8) * local_6d0) * 4);
                if ((*local_188 & 3) == 1) {
                  local_128 = local_610;
                  local_12c = local_730;
                  local_130 = local_72c;
                  local_134 = local_728;
                  local_138 = local_724;
                  local_1f8 = local_530;
                  local_1fc = local_730;
                  local_200 = local_72c;
                  local_204 = local_728;
                  local_208 = local_724;
                  *(undefined8 *)
                   (*local_530 +
                   ((long)(local_730 - (int)local_530[4]) +
                    (long)(local_72c - *(int *)((long)local_530 + 0x24)) * local_530[1] +
                    (long)(local_728 - (int)local_530[5]) * local_530[2] +
                   (long)local_724 * local_530[3]) * 8) =
                       *(undefined8 *)
                        (*local_610 +
                        ((long)(local_730 - (int)local_610[4]) +
                         (long)(local_72c - *(int *)((long)local_610 + 0x24)) * local_610[1] +
                         (long)(local_728 - (int)local_610[5]) * local_610[2] +
                        (long)local_724 * local_610[3]) * 8);
                  local_140 = local_658;
                  local_144 = local_730;
                  local_148 = local_72c;
                  local_14c = local_728;
                  local_150 = local_724;
                  local_210 = local_578;
                  local_214 = local_730;
                  local_218 = local_72c;
                  local_21c = local_728;
                  local_220 = local_724;
                  *(undefined8 *)
                   (*local_578 +
                   ((long)(local_730 - (int)local_578[4]) +
                    (long)(local_72c - *(int *)((long)local_578 + 0x24)) * local_578[1] +
                    (long)(local_728 - (int)local_578[5]) * local_578[2] +
                   (long)local_724 * local_578[3]) * 8) =
                       *(undefined8 *)
                        (*local_658 +
                        ((long)(local_730 - (int)local_658[4]) +
                         (long)(local_72c - *(int *)((long)local_658 + 0x24)) * local_658[1] +
                         (long)(local_728 - (int)local_658[5]) * local_658[2] +
                        (long)local_724 * local_658[3]) * 8);
                }
                else {
                  local_228 = local_530;
                  local_22c = local_730;
                  local_230 = local_72c;
                  local_234 = local_728;
                  local_238 = local_724;
                  *(undefined8 *)
                   (*local_530 +
                   ((long)(local_730 - (int)local_530[4]) +
                    (long)(local_72c - *(int *)((long)local_530 + 0x24)) * local_530[1] +
                    (long)(local_728 - (int)local_530[5]) * local_530[2] +
                   (long)local_724 * local_530[3]) * 8) = 0;
                  local_240 = local_578;
                  local_244 = local_730;
                  local_248 = local_72c;
                  local_24c = local_728;
                  local_250 = local_724;
                  *(undefined8 *)
                   (*local_578 +
                   ((long)(local_730 - (int)local_578[4]) +
                    (long)(local_72c - *(int *)((long)local_578 + 0x24)) * local_578[1] +
                    (long)(local_728 - (int)local_578[5]) * local_578[2] +
                   (long)local_724 * local_578[3]) * 8) = 0;
                }
                local_198 = local_6a0;
              }
            }
          }
        }
      }
      else {
        local_390 = local_508;
        local_8 = local_508;
        local_c = 0;
        local_384 = *local_508;
        local_18 = local_508;
        local_1c = 1;
        iStack_380 = local_508[1];
        local_3a0 = *(undefined8 *)local_508;
        local_28 = local_508;
        local_2c = 2;
        local_398 = local_508[2];
        local_318 = local_508;
        local_98 = local_508 + 3;
        local_9c = 0;
        local_30c = *local_98;
        local_a8 = local_508 + 3;
        local_ac = 1;
        iStack_308 = local_508[4];
        local_328 = *(undefined8 *)local_98;
        local_b8 = local_508 + 3;
        local_bc = 2;
        local_320 = local_508[5];
        for (local_774 = 0; local_778 = local_398, local_37c = local_398, local_304 = local_320,
            local_774 < local_3e4; local_774 = local_774 + 1) {
          for (; local_77c = iStack_380, local_778 <= local_320; local_778 = local_778 + 1) {
            for (; local_780 = local_384, local_77c <= iStack_308; local_77c = local_77c + 1) {
              for (; local_780 <= local_30c; local_780 = local_780 + 1) {
                local_1b4 = local_780;
                local_1b8 = local_77c;
                local_1bc = local_778;
                local_190 = (uint *)(local_6e0 +
                                    ((long)(local_780 - local_6c0) +
                                     (local_77c - local_6bc) * local_6d8 +
                                    (local_778 - local_6b8) * local_6d0) * 4);
                if ((*local_190 & 3) == 1) {
                  local_158 = local_610;
                  local_15c = local_780;
                  local_160 = local_77c;
                  local_164 = local_778;
                  local_168 = local_774;
                  local_258 = local_530;
                  local_25c = local_780;
                  local_260 = local_77c;
                  local_264 = local_778;
                  local_268 = local_774;
                  *(undefined8 *)
                   (*local_530 +
                   ((long)(local_780 - (int)local_530[4]) +
                    (long)(local_77c - *(int *)((long)local_530 + 0x24)) * local_530[1] +
                    (long)(local_778 - (int)local_530[5]) * local_530[2] +
                   (long)local_774 * local_530[3]) * 8) =
                       *(undefined8 *)
                        (*local_610 +
                        ((long)(local_780 - (int)local_610[4]) +
                         (long)(local_77c - *(int *)((long)local_610 + 0x24)) * local_610[1] +
                         (long)(local_778 - (int)local_610[5]) * local_610[2] +
                        (long)local_774 * local_610[3]) * 8);
                  local_170 = local_658;
                  local_174 = local_780;
                  local_178 = local_77c;
                  local_17c = local_778;
                  local_180 = 0;
                  local_270 = local_578;
                  local_274 = local_780;
                  local_278 = local_77c;
                  local_27c = local_778;
                  local_280 = local_774;
                  *(undefined8 *)
                   (*local_578 +
                   ((long)(local_780 - (int)local_578[4]) +
                    (long)(local_77c - *(int *)((long)local_578 + 0x24)) * local_578[1] +
                    (long)(local_778 - (int)local_578[5]) * local_578[2] +
                   (long)local_774 * local_578[3]) * 8) =
                       *(undefined8 *)
                        (*local_658 +
                        ((long)(local_780 - (int)local_658[4]) +
                         (long)(local_77c - *(int *)((long)local_658 + 0x24)) * local_658[1] +
                        (long)(local_778 - (int)local_658[5]) * local_658[2]) * 8);
                }
                else {
                  local_288 = local_530;
                  local_28c = local_780;
                  local_290 = local_77c;
                  local_294 = local_778;
                  local_298 = local_774;
                  *(undefined8 *)
                   (*local_530 +
                   ((long)(local_780 - (int)local_530[4]) +
                    (long)(local_77c - *(int *)((long)local_530 + 0x24)) * local_530[1] +
                    (long)(local_778 - (int)local_530[5]) * local_530[2] +
                   (long)local_774 * local_530[3]) * 8) = 0;
                  local_2a0 = local_578;
                  local_2a4 = local_780;
                  local_2a8 = local_77c;
                  local_2ac = local_778;
                  local_2b0 = local_774;
                  *(undefined8 *)
                   (*local_578 +
                   ((long)(local_780 - (int)local_578[4]) +
                    (long)(local_77c - *(int *)((long)local_578 + 0x24)) * local_578[1] +
                    (long)(local_778 - (int)local_578[5]) * local_578[2] +
                   (long)local_774 * local_578[3]) * 8) = 0;
                }
                local_1b0 = local_6a0;
              }
            }
          }
        }
      }
    }
    MFIter::operator++(&local_500);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffff7f0);
  if ((local_3e9 & 1) != 0) {
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
    this_03 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                        ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                         0x177ae1a);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)this_03,(size_type)in_stack_fffffffffffff7e8);
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)this_03,
               (size_type)in_stack_fffffffffffff7e8);
    Geometry::periodicity(in_stack_fffffffffffff820);
    FabArray<amrex::FArrayBox>::FillBoundary<double>(this_00,period,(bool)cross);
  }
  return;
}

Assistant:

void
MLEBABecLap::setEBDirichlet (int amrlev, const MultiFab& phi, const MultiFab& beta)
{
    const int ncomp = getNComp();
    const int beta_ncomp = beta.nComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    AMREX_ALWAYS_ASSERT(beta_ncomp == 1 || beta_ncomp == ncomp);

    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phiout = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                phiout(i,j,k,n) = 0.0;
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            Array4<Real const> const& phiin = phi.const_array(mfi);
            Array4<Real const> const& betain = beta.const_array(mfi);
            const auto& flag = flags->const_array(mfi);
            if (beta_ncomp == ncomp) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                {
                    if (flag(i,j,k).isSingleValued()) {
                        phiout(i,j,k,n) = phiin(i,j,k,n);
                        betaout(i,j,k,n) = betain(i,j,k,n);
                    } else {
                        phiout(i,j,k,n) = 0.0;
                        betaout(i,j,k,n) = 0.0;
                    }
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                {
                    if (flag(i,j,k).isSingleValued()) {
                        phiout(i,j,k,n) = phiin(i,j,k,n);
                        betaout(i,j,k,n) = betain(i,j,k,0);
                    } else {
                        phiout(i,j,k,n) = 0.0;
                        betaout(i,j,k,n) = 0.0;
                    }
                });
            }
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}